

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PSpriteAmiga __thiscall DataSourceAmiga::get_ground_sprite(DataSourceAmiga *this,size_t index)

{
  byte bVar1;
  byte filling;
  byte *pbVar2;
  _func_int **pp_Var3;
  PBuffer *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSpriteAmiga PVar4;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  PBuffer data;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,(__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)(index + 0x58));
  get_data_from_catalog((DataSourceAmiga *)&data,index,4,in_RDX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
         (_func_int **)0x0;
    (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    pbVar2 = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read;
    bVar1 = *pbVar2;
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = pbVar2 + 1;
    filling = pbVar2[1];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = pbVar2 + 2;
    Buffer::pop_tail((Buffer *)local_58);
    decode_planned_sprite
              (this,(PBuffer *)(ulong)bVar1,(size_t)local_58,4,'\x15',filling,
               (uint8_t *)(ulong)bVar1,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    pp_Var3 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
    if (pp_Var3 != (_func_int **)0x0) {
      pp_Var3[3] = (_func_int *)0x1;
      pp_Var3[4] = (_func_int *)0x0;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar4.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::get_ground_sprite(size_t index) {
  PBuffer data = get_data_from_catalog(4, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  uint8_t filled = data->pop<uint8_t>();
  uint8_t compressed = data->pop<uint8_t>();

  PSpriteAmiga sprite = decode_planned_sprite(data->pop_tail(), 4, 21,
                                              compressed, filled, palette);

  if (sprite) {
    sprite->set_delta(1, 0);
    sprite->set_offset(0, 0);
  }

  return sprite;
}